

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::get_tex_parameteriiv(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  GLint params [1];
  GLint local_34;
  string local_30;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    local_34 = 0;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "GL_INVALID_ENUM is generated if target or pname is not an accepted value.","");
    NegativeTestContext::beginSection(ctx,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glGetTexParameterIiv
              (&ctx->super_CallLogWrapper,0xffffffff,0x2800,&local_34);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glGetTexParameterIiv(&ctx->super_CallLogWrapper,0xde1,0xffffffff,&local_34)
    ;
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glGetTexParameterIiv
              (&ctx->super_CallLogWrapper,0xffffffff,0xffffffff,&local_34);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeStateApiTests.cpp"
             ,0x1df);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void get_tex_parameteriiv (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a higher context version.");

	GLint params[1] = { 0 };

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not an accepted value.");
	ctx.glGetTexParameterIiv(-1, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIiv(GL_TEXTURE_2D, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glGetTexParameterIiv(-1, -1, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}